

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_states.hpp
# Opt level: O0

event_set *
afsm::detail::state_base_impl<afsm::test::ortho_sm_def,_false>::static_deferrable_events(void)

{
  int iVar1;
  type_tuple<> local_9;
  
  if (state_base_impl<afsm::test::ortho_sm_def,false>::static_deferrable_events()::evts_ == '\0') {
    iVar1 = __cxa_guard_acquire(&state_base_impl<afsm::test::ortho_sm_def,false>::
                                 static_deferrable_events()::evts_);
    if (iVar1 != 0) {
      make_event_set<>(&static_deferrable_events::evts_,&local_9);
      __cxa_atexit(std::
                   set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
                   ::~set,&static_deferrable_events::evts_,&__dso_handle);
      __cxa_guard_release(&state_base_impl<afsm::test::ortho_sm_def,false>::
                           static_deferrable_events()::evts_);
    }
  }
  return &static_deferrable_events::evts_;
}

Assistant:

static event_set const&
    static_deferrable_events()
    {
        static event_set evts_ = make_event_set(deferred_events{});
        return evts_;
    }